

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_link(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,uv_fs_cb cb)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t new_path_len;
  size_t path_len;
  uv_fs_cb cb_local;
  char *new_path_local;
  char *path_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->type = UV_FS;
    req->active_queue[0] = loop->active_reqs;
    req->active_queue[1] = loop->active_reqs[1];
    *(void ***)req->active_queue[1] = req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_LINK;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  if (cb == (uv_fs_cb)0x0) {
    req->path = path;
    req->new_path = new_path;
  }
  else {
    sVar1 = strlen(path);
    sVar1 = sVar1 + 1;
    sVar2 = strlen(new_path);
    pcVar3 = (char *)uv__malloc(sVar1 + sVar2 + 1);
    req->path = pcVar3;
    if (req->path == (char *)0x0) {
      if (loop->active_reqs != (void **)loop->active_reqs[0]) {
        *(void **)req->active_queue[1] = req->active_queue[0];
        *(void **)((long)req->active_queue[0] + 8) = req->active_queue[1];
        return -0xc;
      }
      __assert_fail("uv__has_active_reqs(loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                    ,0x47b,
                    "int uv_fs_link(uv_loop_t *, uv_fs_t *, const char *, const char *, uv_fs_cb)");
    }
    req->new_path = req->path + sVar1;
    memcpy(req->path,path,sVar1);
    memcpy(req->new_path,new_path,sVar2 + 1);
  }
  if (cb == (uv_fs_cb)0x0) {
    uv__fs_work(&req->work_req);
    loop_local._4_4_ = (int)req->result;
  }
  else {
    uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_link(uv_loop_t* loop,
               uv_fs_t* req,
               const char* path,
               const char* new_path,
               uv_fs_cb cb) {
  INIT(LINK);
  PATH2;
  POST;
}